

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O0

vector<KTX_header2,_std::allocator<KTX_header2>_> * __thiscall
ktx::CommandCompare::read<KTX_header2>
          (CommandCompare *this,InputStreams *streams,size_t offset,string_view what)

{
  size_type sVar1;
  reference pvVar2;
  reference __nbytes;
  void *in_RCX;
  array<ktx::InputStream,_2UL> *in_RDX;
  CommandCompare *in_RSI;
  vector<KTX_header2,_std::allocator<KTX_header2>_> *in_RDI;
  size_type in_R8;
  array<ktx::InputStream,_2UL> *in_R9;
  size_t i;
  vector<KTX_header2,_std::allocator<KTX_header2>_> *result;
  size_type in_stack_ffffffffffffff48;
  array<ktx::InputStream,_2UL> *in_stack_ffffffffffffff50;
  allocator_type *in_stack_ffffffffffffff60;
  void *__buf;
  size_type in_stack_ffffffffffffff68;
  size_type sVar3;
  vector<KTX_header2,_std::allocator<KTX_header2>_> *this_00;
  undefined8 local_50;
  
  this_00 = in_RDI;
  std::array<ktx::InputStream,_2UL>::size(in_RDX);
  std::allocator<KTX_header2>::allocator((allocator<KTX_header2> *)0x173dad);
  std::vector<KTX_header2,_std::allocator<KTX_header2>_>::vector
            (this_00,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::allocator<KTX_header2>::~allocator((allocator<KTX_header2> *)0x173dd0);
  local_50 = 0;
  while (sVar3 = local_50, sVar1 = std::array<ktx::InputStream,_2UL>::size(in_RDX), sVar3 < sVar1) {
    pvVar2 = std::array<ktx::InputStream,_2UL>::operator[]
                       (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    __buf = in_RCX;
    __nbytes = std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[](in_RDI,local_50);
    in_stack_ffffffffffffff48 = in_R8;
    in_stack_ffffffffffffff50 = in_R9;
    read(in_RSI,(int)pvVar2,__buf,(size_t)__nbytes);
    local_50 = local_50 + 1;
  }
  return this_00;
}

Assistant:

std::vector<T> read(InputStreams& streams, std::size_t offset, std::string_view what) {
        std::vector<T> result(streams.size());
        for (std::size_t i = 0; i < streams.size(); ++i) {
            read(streams[i], offset, &result[i], sizeof(T), what);
        }
        return result;
    }